

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# castchannel.h
# Opt level: O2

bool __thiscall
CastMessage::out_content
          (CastMessage *this,
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          *pout)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ec::msg_protoc3::
          out_var<unsigned_int,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,void>
                    ((msg_protoc3 *)this,pout,1,this->_protocol_version,true);
  if (bVar1) {
    bVar1 = ec::msg_protoc3::
            out_str<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                      ((msg_protoc3 *)this,pout,2,(this->_source_id)._M_dataplus._M_p);
    if (bVar1) {
      bVar1 = ec::msg_protoc3::
              out_str<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                        ((msg_protoc3 *)this,pout,3,(this->_destination_id)._M_dataplus._M_p);
      bVar2 = ec::msg_protoc3::
              out_str<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                        ((msg_protoc3 *)this,pout,4,(this->_namespace)._M_dataplus._M_p);
      if ((bVar1) || (bVar2)) {
        bVar1 = ec::msg_protoc3::
                out_var<unsigned_int,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,void>
                          ((msg_protoc3 *)this,pout,5,this->_payload_type,true);
        if (bVar1) {
          bVar1 = ec::msg_protoc3::
                  out_str<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                            ((msg_protoc3 *)this,pout,6,(this->_payload_utf8)._M_dataplus._M_p);
          if (bVar1) {
            bVar1 = ec::msg_protoc3::
                    out_cls<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                              ((msg_protoc3 *)this,pout,7,(this->_payload_binary)._M_dataplus._M_p,
                               (this->_payload_binary)._M_string_length);
            return bVar1;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool out_content(std::basic_string<uint8_t> *pout) override {
        return
            out_var(pout, id_protocol_version, _protocol_version, true) &&
            out_str(pout, id_source_id, _source_id.c_str()) &&
            out_str(pout, id_destination_id, _destination_id.c_str()) +
            out_str(pout, id_namespace, _namespace.c_str()) &&
            out_var(pout, id_payload_type, _payload_type, true) &&
            out_str(pout, id_payload_utf8, _payload_utf8.c_str()) &&
            out_cls(pout, id_payload_binary, _payload_binary.data(), _payload_binary.size());
    }